

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall capnp::anon_unknown_79::Input::consumeWhitespace(Input *this)

{
  byte bVar1;
  
  while( true ) {
    if (((this->wrapped).size_ == 0) || (*(this->wrapped).ptr == '\0')) {
      return;
    }
    bVar1 = nextChar(this);
    if (0x20 < bVar1) {
      return;
    }
    if ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0) break;
    advance(this,1);
  }
  return;
}

Assistant:

void consumeWhitespace() {
    consumeWhile([](char chr) {
      return (
        chr == ' '  ||
        chr == '\n' ||
        chr == '\r' ||
        chr == '\t'
      );
    });
  }